

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManEvaluateMapping(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  timespec ts;
  timespec local_40;
  
  uVar8 = (ulong)(uint)DelayGlo;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->pGia->vEdge1 == (Vec_Int_t *)0x0) {
    p->vPath->nSize = 0;
    Sbl_ManCreateTiming(p,DelayGlo);
    Sbl_ManGetCurrentMapping(p);
    pVVar3 = p->vAnds;
    if (pVVar3->nSize < 1) {
      uVar10 = 0xffffffff;
    }
    else {
      lVar7 = 0;
      lVar9 = 0;
      do {
        if (p->vWindow->nSize <= lVar9) goto LAB_007a493a;
        uVar2 = pVVar3->pArray[lVar9];
        uVar10 = (ulong)uVar2;
        iVar1 = Sbl_ManComputeDelay(p,(int)uVar8,
                                    (Vec_Int_t *)((long)&p->vWindow->pArray->nCap + lVar7));
        if (((int)uVar2 < 0) || (p->vArrs->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vArrs->pArray[uVar10] = iVar1;
        lVar9 = lVar9 + 1;
        pVVar3 = p->vAnds;
        lVar7 = lVar7 + 0x10;
      } while (lVar9 < pVVar3->nSize);
    }
    uVar2 = p->vRoots->nSize;
    if ((int)uVar2 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        iVar1 = p->vRoots->pArray[uVar8];
        uVar10 = (ulong)iVar1;
        if ((((long)uVar10 < 0) || (p->vArrs->nSize <= iVar1)) || (p->vReqs->nSize <= iVar1))
        goto LAB_007a4959;
        if (p->vReqs->pArray[uVar10] < p->vArrs->pArray[uVar10]) goto LAB_007a47c9;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      uVar8 = (ulong)uVar2;
    }
LAB_007a47c9:
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeTime = p->timeTime + lVar7 + lVar6;
    iVar1 = 1;
    if ((int)uVar8 != p->vRoots->nSize) {
      uVar4 = (ulong)p->vAnds->nSize;
      uVar11 = 0xffffffff;
      if (0 < (long)uVar4) {
        uVar5 = 0;
        do {
          if (p->vAnds->pArray[uVar5] == (int)uVar10) {
            uVar11 = uVar5 & 0xffffffff;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if ((int)uVar11 < 0) {
        __assert_fail("iAnd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,499,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
      }
      if (p->vRootVars->nSize <= (int)uVar8) {
LAB_007a4959:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)uVar11 != p->vRootVars->pArray[uVar8 & 0xffffffff]) {
        __assert_fail("iAnd == Vec_IntEntry(p->vRootVars, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x1f5,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
      }
      do {
        iVar1 = (int)uVar11;
        if (iVar1 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(p->vPath,iVar1 * 2 + 1);
        if (p->vWindow->nSize <= iVar1) {
LAB_007a493a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar2 = Sbl_ManCriticalFanin(p,(int)uVar10,p->vWindow->pArray + uVar11);
        if ((int)uVar2 < 1) {
          __assert_fail("iLut > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                        ,0x1fd,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
        }
        uVar10 = (ulong)uVar2;
        uVar8 = (ulong)p->vAnds->nSize;
        uVar11 = 0xffffffff;
        if (0 < (long)uVar8) {
          uVar4 = 0;
          do {
            if (p->vAnds->pArray[uVar4] == uVar2) {
              uVar11 = uVar4 & 0xffffffff;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (uVar8 != uVar4);
        }
      } while ((int)uVar11 != -1);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = Sbl_ManEvaluateMappingEdge(p,DelayGlo);
  }
  return iVar1;
}

Assistant:

int Sbl_ManEvaluateMapping( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vFanins;
    int i, iLut = -1, iAnd, Delay, Required;
    if ( p->pGia->vEdge1 )
        return Sbl_ManEvaluateMappingEdge( p, DelayGlo );
    Vec_IntClear( p->vPath );
    // derive timing
    Sbl_ManCreateTiming( p, DelayGlo );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    Vec_IntForEachEntry( p->vAnds, iLut, i )
    {
        vFanins = Vec_WecEntry( p->vWindow, i );
        Delay   = Sbl_ManComputeDelay( p, iLut, vFanins );
        Vec_IntWriteEntry( p->vArrs, iLut, Delay );
    }
    // compare timing at the root nodes
    Vec_IntForEachEntry( p->vRoots, iLut, i )
    {
        Delay    = Vec_IntEntry( p->vArrs, iLut );
        Required = Vec_IntEntry( p->vReqs, iLut );
        if ( Delay > Required ) // updated timing exceeded original timing
            break;
    }
    p->timeTime += Abc_Clock() - clk;
    if ( i == Vec_IntSize(p->vRoots) )
        return 1;
    // derive the critical path

    // find SAT variable of the node whose GIA ID is "iLut"
    iAnd = Vec_IntFind( p->vAnds, iLut );
    assert( iAnd >= 0 );
    // critical path begins in node "iLut", which is i-th root of the window
    assert( iAnd == Vec_IntEntry(p->vRootVars, i) );
    while ( 1 )
    {
        Vec_IntPush( p->vPath, Abc_Var2Lit(iAnd, 1) );
        // find fanins of this node
        vFanins = Vec_WecEntry( p->vWindow, iAnd );
        // find critical fanin
        iLut = Sbl_ManCriticalFanin( p, iLut, vFanins );
        assert( iLut > 0  );
        // find SAT variable of the node whose GIA ID is "iLut"
        iAnd = Vec_IntFind( p->vAnds, iLut );
        if ( iAnd == -1 )
            break;
    }
    return 0;
}